

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O2

void __thiscall
cmCursesCacheEntryComposite::~cmCursesCacheEntryComposite(cmCursesCacheEntryComposite *this)

{
  std::__cxx11::string::~string((string *)&this->Key);
  std::unique_ptr<cmCursesWidget,_std::default_delete<cmCursesWidget>_>::~unique_ptr(&this->Entry);
  std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::~unique_ptr
            (&this->IsNewLabel);
  std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::~unique_ptr
            (&this->Label);
  return;
}

Assistant:

cmCursesCacheEntryComposite::~cmCursesCacheEntryComposite() = default;